

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

char * get_func_static_var_name(c2m_ctx_t c2m_ctx,char *suffix,decl_t decl)

{
  char *pcVar1;
  char local_58 [4];
  uint func_scope_num;
  char prefix [50];
  decl_t decl_local;
  char *suffix_local;
  c2m_ctx_t c2m_ctx_local;
  
  unique0x1000005a = decl;
  sprintf(local_58,"S%u_",(ulong)*(uint *)((long)decl->scope->attr + 4));
  pcVar1 = get_func_var_name(c2m_ctx,local_58,suffix);
  return pcVar1;
}

Assistant:

static const char *get_func_static_var_name (c2m_ctx_t c2m_ctx, const char *suffix, decl_t decl) {
  char prefix[50];
  unsigned func_scope_num = ((struct node_scope *) decl->scope->attr)->func_scope_num;

  sprintf (prefix, "S%u_", func_scope_num);
  return get_func_var_name (c2m_ctx, prefix, suffix);
}